

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition.cpp
# Opt level: O0

string * fs_filesystem_type_abi_cxx11_(string *__return_storage_ptr__,string_view path)

{
  string_view path_00;
  undefined1 local_30 [8];
  error_code ec;
  string_view path_local;
  
  ec._M_cat = (error_category *)path._M_len;
  std::error_code::error_code((error_code *)local_30);
  path_00._M_str = path._M_str;
  path_00._M_len = (size_t)ec._M_cat;
  fs_type_linux_abi_cxx11_(__return_storage_ptr__,path_00);
  return __return_storage_ptr__;
}

Assistant:

std::string fs_filesystem_type(std::string_view path)
{
  // return name of filesystem type if known

  std::error_code ec;

#if defined(_WIN32) || defined(__CYGWIN__)

  std::string r(path);

  // Cygwin: assume user input Cygwin path root directly.
  if(!fs_is_cygwin()){

    r = fs_root_name(r);
    if(r.empty())
      return {};

    // GetVolumeInformationA requires a trailing backslash
    r.push_back('\\');
  }

  if(fs_trace) std::cout << "TRACE:filesystem_type(" << path << ") root: " << r << "\n";

  // https://learn.microsoft.com/en-us/windows/win32/api/fileapi/nf-fileapi-getvolumeinformationa
  if(std::string name(MAX_PATH+1, '\0');
      GetVolumeInformationA(r.data(), nullptr, 0, nullptr, nullptr, nullptr, name.data(), static_cast<DWORD>(name.size())))
    return fs_trim(name);
#elif defined(__linux__)
# ifdef HAVE_LINUX_MAGIC_H
  return fs_type_linux(path);
# else
  ec = std::make_error_code(std::errc::function_not_supported);
# endif
#elif defined(__APPLE__) || defined(BSD)
  struct statfs s;
  if(!statfs(path.data(), &s))
    return s.f_fstypename;
#else
  ec = std::make_error_code(std::errc::function_not_supported);
#endif

  fs_print_error(path, __func__, ec);
  return {};
}